

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmBitImEa<(moira::Instr)34,(moira::Mode)6,(moira::Size)1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 v;
  StrWriter *pSVar1;
  StrWriter *in_RSI;
  Moira *in_RDI;
  Ea<(moira::Mode)6,_(moira::Size)1> dst;
  u32 src;
  StrWriter *in_stack_ffffffffffffffa8;
  UInt in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  u16 in_stack_ffffffffffffffce;
  Moira *in_stack_ffffffffffffffd0;
  
  v = dasmRead<(moira::Size)1>(in_RDI,(u32 *)in_stack_ffffffffffffffa8);
  Op<(moira::Mode)6,(moira::Size)1>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffce,
             (u32 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0.raw));
  pSVar1 = StrWriter::operator<<(in_RSI);
  pSVar1 = StrWriter::operator<<(pSVar1,(Align)(in_RDI->tab).raw);
  StrWriter::operator<<(pSVar1,"#");
  UInt::UInt((UInt *)&stack0xffffffffffffffc0,v);
  pSVar1 = StrWriter::operator<<(in_stack_ffffffffffffffa8,(UInt)(u32)((ulong)in_RDI >> 0x20));
  StrWriter::operator<<(pSVar1,", ");
  StrWriter::operator<<
            ((StrWriter *)in_RDI,(Ea<(moira::Mode)6,_(moira::Size)1> *)in_stack_ffffffffffffffa8);
  return;
}

Assistant:

void
Moira::dasmBitImEa(StrWriter &str, u32 &addr, u16 op)
{
    auto src = dasmRead<S>(addr);
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << tab << "#" << UInt(src) << ", " << dst;
}